

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O2

int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *p,int iLit0,int iLit1)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Kit_DsdObj_t *pKVar5;
  Kit_DsdObj_t *pKVar6;
  ulong uVar7;
  
  iVar1 = Abc_LitIsCompl(iLit0);
  if (iVar1 != 0) {
    __assert_fail("!Abc_LitIsCompl(iLit0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                  ,0x108,"int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *, int, int)");
  }
  iVar1 = Abc_LitIsCompl(iLit1);
  if (iVar1 != 0) {
    __assert_fail("!Abc_LitIsCompl(iLit1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                  ,0x109,"int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *, int, int)");
  }
  iVar1 = Abc_Lit2Var(iLit0);
  pKVar5 = Kit_DsdNtkObj(p,iVar1);
  iVar1 = Abc_Lit2Var(iLit1);
  pKVar6 = Kit_DsdNtkObj(p,iVar1);
  iVar1 = 1;
  if (pKVar5 != (Kit_DsdObj_t *)0x0 || pKVar6 != (Kit_DsdObj_t *)0x0) {
    iVar3 = 0;
    iVar1 = 0;
    if (pKVar5 != (Kit_DsdObj_t *)0x0 && pKVar6 != (Kit_DsdObj_t *)0x0) {
      iVar1 = iVar3;
      if ((((uint)*pKVar6 ^ (uint)*pKVar5) < 0x4000000) &&
         (uVar2 = (uint)*pKVar5 >> 6 & 7, uVar2 == ((uint)*pKVar6 >> 6 & 7))) {
        if (uVar2 - 3 < 2) {
          uVar7 = 0;
          iVar1 = 0;
          do {
            if ((uint)*pKVar5 >> 0x1a <= uVar7) {
              return 1;
            }
            iVar3 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar5[1].field_0x0 + uVar7 * 2));
            iVar4 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar6[1].field_0x0 + uVar7 * 2));
            if (iVar3 != iVar4) {
              return 0;
            }
            iVar3 = Amap_CreateCheckEqual_rec
                              (p,*(ushort *)(&pKVar5[1].field_0x0 + uVar7 * 2) & 0xfffffffe,
                               *(ushort *)(&pKVar6[1].field_0x0 + uVar7 * 2) & 0xfffffffe);
            uVar7 = uVar7 + 1;
          } while (iVar3 != 0);
        }
        else if (uVar2 != 5) {
          __assert_fail("pObj0->Type == KIT_DSD_AND || pObj0->Type == KIT_DSD_XOR",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                        ,0x116,"int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *, int, int)");
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int Amap_CreateCheckEqual_rec( Kit_DsdNtk_t * p, int iLit0, int iLit1 )
{
    Kit_DsdObj_t * pObj0, * pObj1; 
    int i;
    assert( !Abc_LitIsCompl(iLit0) );
    assert( !Abc_LitIsCompl(iLit1) );
    pObj0 = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit0) );
    pObj1 = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit1) );
    if ( pObj0 == NULL && pObj1 == NULL )
        return 1;
    if ( pObj0 == NULL || pObj1 == NULL )
        return 0;
    if ( pObj0->Type != pObj1->Type )
        return 0;
    if ( pObj0->nFans != pObj1->nFans )
        return 0;
    if ( pObj0->Type == KIT_DSD_PRIME )
        return 0;
    assert( pObj0->Type == KIT_DSD_AND || pObj0->Type == KIT_DSD_XOR );
    for ( i = 0; i < (int)pObj0->nFans; i++ )
    {
        if ( Abc_LitIsCompl(pObj0->pFans[i]) != Abc_LitIsCompl(pObj1->pFans[i]) )
            return 0;
        if ( !Amap_CreateCheckEqual_rec( p, Abc_LitRegular(pObj0->pFans[i]), Abc_LitRegular(pObj1->pFans[i]) ) )
            return 0;
    }
    return 1;
}